

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int geopolyInit(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr,
               int isCreate)

{
  int iVar1;
  int iVar2;
  size_t __n;
  size_t __n_00;
  Rtree *pRtree;
  sqlite3_str *p;
  char *pcVar3;
  char *pcVar4;
  sqlite3_vtab *psVar5;
  undefined4 in_register_00000014;
  long lVar6;
  sqlite3_uint64 n;
  long lVar7;
  
  lVar6 = CONCAT44(in_register_00000014,argc);
  sqlite3_vtab_config(db,1);
  sqlite3_vtab_config(db,2);
  __n = strlen(*(char **)(lVar6 + 8));
  __n_00 = strlen(*(char **)(lVar6 + 0x10));
  n = __n + __n_00 * 2 + 0x3d0;
  pRtree = (Rtree *)sqlite3_malloc64(n);
  if (pRtree == (Rtree *)0x0) {
    iVar2 = 7;
  }
  else {
    memset(pRtree,0,n);
    pRtree->nBusy = 1;
    (pRtree->base).pModule = &rtreeModule;
    pRtree->zDb = (char *)(pRtree + 1);
    pcVar3 = (char *)((long)&pRtree[1].base.pModule + __n + 1);
    pRtree->zName = pcVar3;
    pRtree->zNodeName = (char *)((long)&pRtree[1].base.pModule + __n_00 + __n + 2);
    pRtree->eCoordType = '\0';
    pRtree->nDim = '\x02';
    pRtree->nDim2 = '\x04';
    memcpy(pRtree + 1,*(void **)(lVar6 + 8),__n);
    memcpy(pcVar3,*(void **)(lVar6 + 0x10),__n_00);
    memcpy(pRtree->zNodeName,*(void **)(lVar6 + 0x10),__n_00);
    builtin_strncpy(pRtree->zNodeName + __n_00,"_node",6);
    p = sqlite3_str_new(db);
    sqlite3_str_appendf(p,"CREATE TABLE x(_shape");
    pRtree->nAux = '\x01';
    pRtree->nAuxNotNull = '\x01';
    for (lVar7 = 3; lVar7 < (int)pAux; lVar7 = lVar7 + 1) {
      pRtree->nAux = pRtree->nAux + '\x01';
      sqlite3_str_appendf(p,",%s",*(undefined8 *)(lVar6 + lVar7 * 8));
    }
    sqlite3_str_appendf(p,");");
    pcVar3 = sqlite3_str_finish(p);
    if (pcVar3 == (char *)0x0) {
      iVar2 = 7;
    }
    else {
      iVar1 = sqlite3_declare_vtab(db,pcVar3);
      iVar2 = 0;
      if (iVar1 != 0) {
        pcVar4 = sqlite3_errmsg(db);
        psVar5 = (sqlite3_vtab *)sqlite3_mprintf("%s",pcVar4);
        *ppVtab = psVar5;
        iVar2 = iVar1;
      }
    }
    sqlite3_free(pcVar3);
    if (iVar2 == 0) {
      pRtree->nBytesPerCell = pRtree->nDim2 * '\x04' + '\b';
      iVar2 = getNodeSize(db,pRtree,(int)pzErr,(char **)ppVtab);
      if (iVar2 == 0) {
        iVar2 = rtreeSqlInit(pRtree,db,*(char **)(lVar6 + 8),*(char **)(lVar6 + 0x10),(int)pzErr);
        if (iVar2 == 0) {
          *argv = (char *)pRtree;
          return 0;
        }
        pcVar3 = sqlite3_errmsg(db);
        psVar5 = (sqlite3_vtab *)sqlite3_mprintf("%s",pcVar3);
        *ppVtab = psVar5;
      }
    }
    rtreeRelease(pRtree);
  }
  return iVar2;
}

Assistant:

static int geopolyInit(
  sqlite3 *db,                        /* Database connection */
  void *pAux,                         /* One of the RTREE_COORD_* constants */
  int argc, const char *const*argv,   /* Parameters to CREATE TABLE statement */
  sqlite3_vtab **ppVtab,              /* OUT: New virtual table */
  char **pzErr,                       /* OUT: Error message, if any */
  int isCreate                        /* True for xCreate, false for xConnect */
){
  int rc = SQLITE_OK;
  Rtree *pRtree;
  sqlite3_int64 nDb;              /* Length of string argv[1] */
  sqlite3_int64 nName;            /* Length of string argv[2] */
  sqlite3_str *pSql;
  char *zSql;
  int ii;
  (void)pAux;

  sqlite3_vtab_config(db, SQLITE_VTAB_CONSTRAINT_SUPPORT, 1);
  sqlite3_vtab_config(db, SQLITE_VTAB_INNOCUOUS);

  /* Allocate the sqlite3_vtab structure */
  nDb = strlen(argv[1]);
  nName = strlen(argv[2]);
  pRtree = (Rtree *)sqlite3_malloc64(sizeof(Rtree)+nDb+nName*2+8);
  if( !pRtree ){
    return SQLITE_NOMEM;
  }
  memset(pRtree, 0, sizeof(Rtree)+nDb+nName*2+8);
  pRtree->nBusy = 1;
  pRtree->base.pModule = &rtreeModule;
  pRtree->zDb = (char *)&pRtree[1];
  pRtree->zName = &pRtree->zDb[nDb+1];
  pRtree->zNodeName = &pRtree->zName[nName+1];
  pRtree->eCoordType = RTREE_COORD_REAL32;
  pRtree->nDim = 2;
  pRtree->nDim2 = 4;
  memcpy(pRtree->zDb, argv[1], nDb);
  memcpy(pRtree->zName, argv[2], nName);
  memcpy(pRtree->zNodeName, argv[2], nName);
  memcpy(&pRtree->zNodeName[nName], "_node", 6);


  /* Create/Connect to the underlying relational database schema. If
  ** that is successful, call sqlite3_declare_vtab() to configure
  ** the r-tree table schema.
  */
  pSql = sqlite3_str_new(db);
  sqlite3_str_appendf(pSql, "CREATE TABLE x(_shape");
  pRtree->nAux = 1;         /* Add one for _shape */
  pRtree->nAuxNotNull = 1;  /* The _shape column is always not-null */
  for(ii=3; ii<argc; ii++){
    pRtree->nAux++;
    sqlite3_str_appendf(pSql, ",%s", argv[ii]);
  }
  sqlite3_str_appendf(pSql, ");");
  zSql = sqlite3_str_finish(pSql);
  if( !zSql ){
    rc = SQLITE_NOMEM;
  }else if( SQLITE_OK!=(rc = sqlite3_declare_vtab(db, zSql)) ){
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
  }
  sqlite3_free(zSql);
  if( rc ) goto geopolyInit_fail;
  pRtree->nBytesPerCell = 8 + pRtree->nDim2*4;

  /* Figure out the node size to use. */
  rc = getNodeSize(db, pRtree, isCreate, pzErr);
  if( rc ) goto geopolyInit_fail;
  rc = rtreeSqlInit(pRtree, db, argv[1], argv[2], isCreate);
  if( rc ){
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
    goto geopolyInit_fail;
  }

  *ppVtab = (sqlite3_vtab *)pRtree;
  return SQLITE_OK;

geopolyInit_fail:
  if( rc==SQLITE_OK ) rc = SQLITE_ERROR;
  assert( *ppVtab==0 );
  assert( pRtree->nBusy==1 );
  rtreeRelease(pRtree);
  return rc;
}